

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_map_insert(mg_map *map,char *key_str,mg_value *value)

{
  uint32_t uVar1;
  mg_map *map_00;
  mg_string *key_00;
  mg_value *in_RDX;
  char *in_RSI;
  mg_map *in_RDI;
  mg_string *key;
  size_t key_size;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_4;
  
  map_00 = (mg_map *)strlen(in_RSI);
  if (map_00 < (mg_map *)0xffffffff) {
    if (in_RDI->size < in_RDI->capacity) {
      uVar1 = mg_map_find_key(map_00,(uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                              in_stack_ffffffffffffffc8);
      if (uVar1 == in_RDI->size) {
        key_00 = mg_string_make2((uint32_t)((ulong)map_00 >> 0x20),in_stack_ffffffffffffffd0);
        if (key_00 == (mg_string *)0x0) {
          local_4 = -3;
        }
        else {
          mg_map_append(in_RDI,key_00,in_RDX);
          local_4 = 0;
        }
      }
      else {
        local_4 = -7;
      }
    }
    else {
      local_4 = -4;
    }
  }
  else {
    local_4 = -0x10;
  }
  return local_4;
}

Assistant:

int mg_map_insert(mg_map *map, const char *key_str, mg_value *value) {
  size_t key_size = strlen(key_str);
  if (key_size >= UINT32_MAX) {
    return MG_ERROR_SIZE_EXCEEDED;
  }
  if (map->size >= map->capacity) {
    return MG_ERROR_CONTAINER_FULL;
  }
  if (mg_map_find_key(map, (uint32_t)key_size, key_str) != map->size) {
    return MG_ERROR_DUPLICATE_KEY;
  }
  mg_string *key = mg_string_make2((uint32_t)key_size, key_str);
  if (!key) {
    return MG_ERROR_OOM;
  }
  mg_map_append(map, key, value);
  return 0;
}